

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O3

void finish_productions(Grammar *g)

{
  Rule **ppRVar1;
  uint uVar2;
  Production *pPVar3;
  Rule **ppRVar4;
  Rule *elem;
  Elem *pEVar5;
  anon_struct_40_4_d8687ec6_for_rules *v;
  
  pPVar3 = *(g->productions).v;
  elem = (Rule *)calloc(1,0xa8);
  elem->prod = pPVar3;
  pEVar5 = (Elem *)calloc(1,0x20);
  elem->end = pEVar5;
  pEVar5->kind = ELEM_END;
  pEVar5->rule = elem;
  elem->action_index = g->action_index;
  pEVar5 = (Elem *)calloc(1,0x20);
  pEVar5->rule = elem;
  (elem->elems).v = (elem->elems).e;
  (elem->elems).n = 1;
  (elem->elems).e[0] = pEVar5;
  ppRVar4 = (pPVar3->rules).v;
  ppRVar1 = (pPVar3->rules).e;
  if (ppRVar4 == (Rule **)0x0) {
    (pPVar3->rules).v = ppRVar1;
    uVar2 = (pPVar3->rules).n;
    (pPVar3->rules).n = uVar2 + 1;
    (pPVar3->rules).e[uVar2] = elem;
    goto LAB_0013a352;
  }
  v = &pPVar3->rules;
  uVar2 = v->n;
  if (ppRVar4 == ppRVar1) {
    if (2 < uVar2) goto LAB_0013a347;
  }
  else if ((uVar2 & 7) == 0) {
LAB_0013a347:
    vec_add_internal(v,elem);
    goto LAB_0013a352;
  }
  v->n = uVar2 + 1;
  ppRVar4[uVar2] = elem;
LAB_0013a352:
  ((*(elem->elems).v)->e).nterm = (g->productions).v[1];
  return;
}

Assistant:

void finish_productions(Grammar *g) {
  Production *pp = g->productions.v[0];
  Rule *rr = new_rule(g, pp);
  vec_add(&rr->elems, new_elem_nterm(NULL, rr));
  vec_add(&pp->rules, rr);
  rr->elems.v[0]->e.nterm = g->productions.v[1];
}